

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O0

void __thiscall kratos::Port::set_active_high(Port *this,bool value)

{
  initializer_list<const_kratos::IRNode_*> __l;
  int iVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 auVar2 [16];
  format_args args;
  string_view format_str;
  _Optional_payload_base<bool> local_fc;
  undefined1 local_fa;
  allocator<const_kratos::IRNode_*> local_f9;
  Port *local_f8;
  Port **local_f0;
  size_type local_e8;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_e0;
  string local_b8;
  bool local_91;
  Port *pPStack_90;
  bool value_local;
  Port *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_80;
  basic_string_view<char> local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_40;
  string *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  local_91 = value;
  pPStack_90 = this;
  iVar1 = (*(this->super_Var).super_IRNode._vptr_IRNode[7])();
  if (iVar1 != 1) {
    local_fa = 1;
    auVar2 = __cxa_allocate_exception(0x10);
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&(this->super_Var).name;
    local_38 = &local_b8;
    local_40 = "{0}\'s width is not 1, which can not be set as active high/low";
    local_68.named_args.data =
         (named_arg_info<char> *)
         fmt::v7::make_args_checked<std::__cxx11::string&,char[62],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)"{0}\'s width is not 1, which can not be set as active high/low",(v7 *)vargs,
                    auVar2._8_8_,
                    (remove_reference_t<std::__cxx11::basic_string<char>_&> *)
                    "{0}\'s width is not 1, which can not be set as active high/low");
    local_50 = &local_68;
    local_78 = fmt::v7::to_string_view<char,_0>(local_40);
    local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&this_local;
    local_30 = local_50;
    local_20 = local_50;
    local_10 = local_50;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0xd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_50->string);
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_80.values_;
    format_str.size_ = (size_t)this_local;
    format_str.data_ = (char *)local_78.size_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_b8,(detail *)local_78.data_,format_str,args);
    local_f0 = &local_f8;
    local_e8 = 1;
    local_f8 = this;
    std::allocator<const_kratos::IRNode_*>::allocator(&local_f9);
    __l._M_len = local_e8;
    __l._M_array = (iterator)local_f0;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              (&local_e0,__l,&local_f9);
    VarException::VarException(auVar2._0_8_,&local_b8,&local_e0);
    local_fa = 0;
    __cxa_throw(auVar2._0_8_,&VarException::typeinfo,VarException::~VarException);
  }
  std::optional<bool>::optional<bool_&,_true>((optional<bool> *)&local_fc,&local_91);
  (this->active_high_).super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool> = local_fc;
  return;
}

Assistant:

void Port::set_active_high(bool value) {
    if (width() != 1)
        throw VarException(
            ::format("{0}'s width is not 1, which can not be set as active high/low", name),
            {this});
    active_high_ = value;
}